

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

void __thiscall chrono::ChStreamFile::Write(ChStreamFile *this,char *data,size_t n)

{
  std::ostream::write(&this->field_0x18,(long)data);
  return;
}

Assistant:

void ChStreamFile::Write(const char* data, size_t n) {
    try {
        file.write(data, n);
    } catch (const std::exception&) {
        throw ChException("Cannot write to stream");
    };
}